

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webmenc.cc
# Opt level: O1

int write_webm_file_header
              (WebmOutputContext *webm_ctx,aom_codec_ctx_t *encoder_ctx,aom_codec_enc_cfg_t *cfg,
              stereo_format_t stereo_fmt,uint fourcc,AvxRational *par,char *encoder_settings)

{
  bool bVar1;
  int iVar2;
  Segment *this;
  long *plVar3;
  uint64_t track_number;
  VideoTrack *this_00;
  aom_fixed_buf_t *__ptr;
  ulong uVar4;
  Tag *this_01;
  long *plVar5;
  double dVar6;
  unique_ptr<mkvmuxer::Segment,_std::default_delete<mkvmuxer::Segment>_> segment;
  uint8_t av1_config_buffer [4];
  string version;
  Av1Config av1_config;
  size_t bytes_written;
  MkvWriter *local_b0;
  Segment *local_a8;
  uint8_t local_94 [4];
  char *local_90 [2];
  char local_80 [16];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_b0 = (MkvWriter *)operator_new(0x18,(nothrow_t *)&std::nothrow);
  if (local_b0 == (MkvWriter *)0x0) {
    local_b0 = (MkvWriter *)0x0;
  }
  else {
    mkvmuxer::MkvWriter::MkvWriter(local_b0,webm_ctx->stream);
  }
  this = (Segment *)operator_new(0x990,(nothrow_t *)&std::nothrow);
  if (this == (Segment *)0x0) {
    this = (Segment *)0x0;
  }
  else {
    mkvmuxer::Segment::Segment(this);
  }
  local_a8 = this;
  if ((local_b0 == (MkvWriter *)0x0) || (this == (Segment *)0x0)) {
    write_webm_file_header_cold_8();
  }
  else {
    bVar1 = mkvmuxer::Segment::Init(this,&local_b0->super_IMkvWriter);
    if (bVar1) {
      this->mode_ = kFile;
      mkvmuxer::Segment::OutputCues(this,true);
      (this->segment_info_).timecode_scale_ = 1000000;
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"aomenc","");
      if (webm_ctx->debug == 0) {
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_50," ","");
        aom_codec_version_str();
        plVar3 = (long *)std::__cxx11::string::append((char *)local_50);
        plVar5 = plVar3 + 2;
        if ((long *)*plVar3 == plVar5) {
          local_60 = *plVar5;
          lStack_58 = plVar3[3];
          local_70 = &local_60;
        }
        else {
          local_60 = *plVar5;
          local_70 = (long *)*plVar3;
        }
        local_68 = plVar3[1];
        *plVar3 = (long)plVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_90,(ulong)local_70);
        if (local_70 != &local_60) {
          operator_delete(local_70);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
      }
      mkvmuxer::SegmentInfo::set_writing_app(&this->segment_info_,local_90[0]);
      track_number = mkvmuxer::Segment::AddVideoTrack(this,cfg->g_w,cfg->g_h,1);
      this_00 = (VideoTrack *)mkvmuxer::Segment::GetTrackByNumber(this,track_number);
      if (this_00 == (VideoTrack *)0x0) {
        write_webm_file_header_cold_7();
        goto LAB_00128fcf;
      }
      __ptr = aom_codec_get_global_headers(encoder_ctx);
      if (__ptr == (aom_fixed_buf_t *)0x0) {
LAB_00128f94:
        write_webm_file_header_cold_6();
LAB_00128fcf:
        iVar2 = -1;
      }
      else {
        iVar2 = get_av1config_from_obu((uint8_t *)__ptr->buf,__ptr->sz,0,(Av1Config *)&local_70);
        if (iVar2 != 0) {
LAB_00128f83:
          free(__ptr->buf);
          free(__ptr);
          goto LAB_00128f94;
        }
        local_94[0] = '\0';
        local_94[1] = '\0';
        local_94[2] = '\0';
        local_94[3] = '\0';
        local_50[0] = (undefined1 *)0x0;
        iVar2 = write_av1config((Av1Config *)&local_70,4,(size_t *)local_50,local_94);
        if (iVar2 != 0) goto LAB_00128f83;
        bVar1 = mkvmuxer::Track::SetCodecPrivate((Track *)this_00,local_94,4);
        free(__ptr->buf);
        free(__ptr);
        if (!bVar1) goto LAB_00128f94;
        bVar1 = mkvmuxer::VideoTrack::SetStereoMode(this_00,(ulong)stereo_fmt);
        if (!bVar1) {
          write_webm_file_header_cold_2();
          goto LAB_00128fcf;
        }
        if (fourcc != 0x31305641) {
          write_webm_file_header_cold_3();
          goto LAB_00128fcf;
        }
        mkvmuxer::Track::set_codec_id((Track *)this_00,"V_AV1");
        if ((1 < par->numerator) || (1 < par->denominator)) {
          dVar6 = (double)(par->numerator * cfg->g_w) / (double)par->denominator + 0.5;
          uVar4 = (ulong)dVar6;
          this_00->display_width_ =
               (long)(dVar6 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4;
          this_00->display_height_ = (ulong)cfg->g_h;
        }
        if (encoder_settings != (char *)0x0) {
          this_01 = mkvmuxer::Segment::AddTag(this);
          if (this_01 == (Tag *)0x0) {
            write_webm_file_header_cold_5();
          }
          else {
            bVar1 = mkvmuxer::Tag::add_simple_tag(this_01,"ENCODER_SETTINGS",encoder_settings);
            if (bVar1) goto LAB_00128f4c;
            write_webm_file_header_cold_4();
          }
          goto LAB_00128fcf;
        }
LAB_00128f4c:
        if (webm_ctx->debug != 0) {
          (this_00->super_Track).uid_ = 0xdeadbeef;
        }
        webm_ctx->writer = local_b0;
        local_a8 = (Segment *)0x0;
        webm_ctx->segment = this;
        local_b0 = (MkvWriter *)0x0;
        iVar2 = 0;
      }
      if (local_90[0] != local_80) {
        operator_delete(local_90[0]);
      }
      goto LAB_00128fe8;
    }
    write_webm_file_header_cold_1();
  }
  iVar2 = -1;
LAB_00128fe8:
  if (local_a8 != (Segment *)0x0) {
    mkvmuxer::Segment::~Segment(local_a8);
    operator_delete(local_a8);
  }
  if (local_b0 != (MkvWriter *)0x0) {
    (*(local_b0->super_IMkvWriter)._vptr_IMkvWriter[6])();
  }
  return iVar2;
}

Assistant:

int write_webm_file_header(struct WebmOutputContext *webm_ctx,
                           aom_codec_ctx_t *encoder_ctx,
                           const aom_codec_enc_cfg_t *cfg,
                           stereo_format_t stereo_fmt, unsigned int fourcc,
                           const struct AvxRational *par,
                           const char *encoder_settings) {
  std::unique_ptr<mkvmuxer::MkvWriter> writer(
      new (std::nothrow) mkvmuxer::MkvWriter(webm_ctx->stream));
  std::unique_ptr<mkvmuxer::Segment> segment(new (std::nothrow)
                                                 mkvmuxer::Segment());
  if (writer == nullptr || segment == nullptr) {
    fprintf(stderr, "webmenc> mkvmuxer objects alloc failed, out of memory?\n");
    return -1;
  }

  bool ok = segment->Init(writer.get());
  if (!ok) {
    fprintf(stderr, "webmenc> mkvmuxer Init failed.\n");
    return -1;
  }

  segment->set_mode(mkvmuxer::Segment::kFile);
  segment->OutputCues(true);

  mkvmuxer::SegmentInfo *const info = segment->GetSegmentInfo();
  if (!info) {
    fprintf(stderr, "webmenc> Cannot retrieve Segment Info.\n");
    return -1;
  }

  const uint64_t kTimecodeScale = 1000000;
  info->set_timecode_scale(kTimecodeScale);
  std::string version = "aomenc";
  if (!webm_ctx->debug) {
    version.append(std::string(" ") + aom_codec_version_str());
  }
  info->set_writing_app(version.c_str());

  const uint64_t video_track_id =
      segment->AddVideoTrack(static_cast<int>(cfg->g_w),
                             static_cast<int>(cfg->g_h), kVideoTrackNumber);
  mkvmuxer::VideoTrack *const video_track = static_cast<mkvmuxer::VideoTrack *>(
      segment->GetTrackByNumber(video_track_id));

  if (!video_track) {
    fprintf(stderr, "webmenc> Video track creation failed.\n");
    return -1;
  }

  ok = false;
  aom_fixed_buf_t *obu_sequence_header =
      aom_codec_get_global_headers(encoder_ctx);
  if (obu_sequence_header) {
    Av1Config av1_config;
    if (get_av1config_from_obu(
            reinterpret_cast<const uint8_t *>(obu_sequence_header->buf),
            obu_sequence_header->sz, false, &av1_config) == 0) {
      uint8_t av1_config_buffer[4] = { 0 };
      size_t bytes_written = 0;
      if (write_av1config(&av1_config, sizeof(av1_config_buffer),
                          &bytes_written, av1_config_buffer) == 0) {
        ok = video_track->SetCodecPrivate(av1_config_buffer,
                                          sizeof(av1_config_buffer));
      }
    }
    free(obu_sequence_header->buf);
    free(obu_sequence_header);
  }
  if (!ok) {
    fprintf(stderr, "webmenc> Unable to set AV1 config.\n");
    return -1;
  }

  ok = video_track->SetStereoMode(stereo_fmt);
  if (!ok) {
    fprintf(stderr, "webmenc> Unable to set stereo mode.\n");
    return -1;
  }

  if (fourcc != AV1_FOURCC) {
    fprintf(stderr, "webmenc> Unsupported codec (unknown 4 CC).\n");
    return -1;
  }
  video_track->set_codec_id("V_AV1");

  if (par->numerator > 1 || par->denominator > 1) {
    // TODO(fgalligan): Add support of DisplayUnit, Display Aspect Ratio type
    // to WebM format.
    const uint64_t display_width = static_cast<uint64_t>(
        ((cfg->g_w * par->numerator * 1.0) / par->denominator) + .5);
    video_track->set_display_width(display_width);
    video_track->set_display_height(cfg->g_h);
  }

  if (encoder_settings != nullptr) {
    mkvmuxer::Tag *tag = segment->AddTag();
    if (tag == nullptr) {
      fprintf(stderr,
              "webmenc> Unable to allocate memory for encoder settings tag.\n");
      return -1;
    }
    ok = tag->add_simple_tag("ENCODER_SETTINGS", encoder_settings);
    if (!ok) {
      fprintf(stderr,
              "webmenc> Unable to allocate memory for encoder settings tag.\n");
      return -1;
    }
  }

  if (webm_ctx->debug) {
    video_track->set_uid(kDebugTrackUid);
  }

  webm_ctx->writer = writer.release();
  webm_ctx->segment = segment.release();
  return 0;
}